

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.h
# Opt level: O0

QPolygonF * __thiscall QGraphicsView::mapToScene(QGraphicsView *this,int ax,int ay,int w,int h)

{
  long lVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  QRect *in_RSI;
  QPolygonF *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  int aleft;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  aleft = (int)((ulong)in_RDI >> 0x20);
  QRect::QRect(in_RSI,aleft,(int)in_RDI,aleft,(int)in_RDI);
  mapToScene((QGraphicsView *)CONCAT44(in_EDX,in_ECX),(QRect *)CONCAT44(in_R8D,in_R9D));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QPolygonF QGraphicsView::mapToScene(int ax, int ay, int w, int h) const
{ return mapToScene(QRect(ax, ay, w, h)); }